

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void open_func(LexState *ls,FuncState *fs)

{
  lua_State *L;
  StkId pTVar1;
  GCObject *pGVar2;
  GCObject *pGVar3;
  
  L = ls->L;
  pGVar2 = (GCObject *)luaF_newproto(L);
  fs->f = (Proto *)pGVar2;
  fs->prev = ls->fs;
  fs->ls = ls;
  fs->L = L;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = -1;
  fs->jpc = -1;
  fs->bl = (BlockCnt *)0x0;
  fs->freereg = 0;
  fs->nk = 0;
  *(undefined8 *)((long)&fs->nk + 3) = 0;
  (pGVar2->p).source = ls->source;
  (pGVar2->p).maxstacksize = '\x02';
  pGVar3 = (GCObject *)luaH_new(L,0,0);
  fs->h = (Table *)pGVar3;
  pTVar1 = L->top;
  (pTVar1->value).gc = pGVar3;
  pTVar1->tt = 5;
  if ((long)L->stack_last - (long)L->top < 0x11) {
    luaD_growstack(L,1);
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1[1].value.gc = pGVar2;
  pTVar1[1].tt = 9;
  if ((long)L->stack_last - (long)L->top < 0x11) {
    luaD_growstack(L,1);
  }
  L->top = L->top + 1;
  return;
}

Assistant:

static void open_func (LexState *ls, FuncState *fs) {
  lua_State *L = ls->L;
  Proto *f = luaF_newproto(L);
  fs->f = f;
  fs->prev = ls->fs;  /* linked list of funcstates */
  fs->ls = ls;
  fs->L = L;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = -1;
  fs->jpc = NO_JUMP;
  fs->freereg = 0;
  fs->nk = 0;
  fs->np = 0;
  fs->nlocvars = 0;
  fs->nactvar = 0;
  fs->bl = NULL;
  f->source = ls->source;
  f->maxstacksize = 2;  /* registers 0/1 are always valid */
  fs->h = luaH_new(L, 0, 0);
  /* anchor table of constants and prototype (to avoid being collected) */
  sethvalue2s(L, L->top, fs->h);
  incr_top(L);
  setptvalue2s(L, L->top, f);
  incr_top(L);
}